

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,bool skipInitialParam,
          SymbolListCItr currSym,SymbolListCItr endSym)

{
  SymbolType SVar1;
  element_type *peVar2;
  element_type *this_00;
  undefined8 this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  const_iterator cVar7;
  Library *__tmp;
  char *format;
  LogLevel level;
  Symbol *pSVar8;
  LibraryIPtr library;
  FunctionMatch newMatch;
  String libraryName;
  element_type *local_128;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  _Stack_120;
  Symbol *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  pointer ptStack_d0;
  uint local_bc;
  LibraryIPtr local_b8;
  pthread_mutex_t *local_a8;
  LibraryIPtr local_a0;
  LibraryIPtr local_90;
  LibraryIPtr local_80;
  Symbol *local_70;
  String local_68;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  local_48;
  
  _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = (element_type *)0x0;
  _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->m_error == false) &&
     ((this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish != currSym._M_current)) {
    SVar1 = (currSym._M_current)->type;
    if (0x43 < (int)SVar1) {
      __assert_fail("static_cast<int>(symbol) < static_cast<int>(SymbolType::NumSymbols)",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                    ,0xc64,"bool Jinx::Impl::IsOperator(SymbolType)");
    }
    if (SVar1 == ParenOpen || SVar1 - And < 0xffffffec) {
      CheckLibraryName_abi_cxx11_(&local_68,this);
      if (local_68._M_string_length == 0) {
        CheckFunctionCall((FunctionMatch *)local_e8,this,&this->m_localFunctions,currSym,endSym,
                          skipInitialParam);
        uVar3 = local_e8._0_8_;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
             _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48._M_impl.super__Vector_impl_data._M_finish =
             _Stack_120._M_impl.super__Vector_impl_data._M_finish;
        local_48._M_impl.super__Vector_impl_data._M_start =
             _Stack_120._M_impl.super__Vector_impl_data._M_start;
        local_128 = (element_type *)local_e8._0_8_;
        _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
        _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_pi;
        _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_d0;
        local_e8._8_8_ = (element_type *)0x0;
        local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ptStack_d0 = (pointer)0x0;
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&local_48);
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         *)(local_e8 + 8));
        if ((element_type *)uVar3 == (element_type *)0x0) {
          local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->m_library).
                  super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          CheckFunctionCall((FunctionMatch *)local_e8,this,&local_80,currSym,endSym,skipInitialParam
                           );
          uVar3 = local_e8._0_8_;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               _Stack_120._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_start =
               _Stack_120._M_impl.super__Vector_impl_data._M_start;
          local_128 = (element_type *)local_e8._0_8_;
          _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
          _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_pi;
          _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_d0;
          local_e8._8_8_ = (element_type *)0x0;
          local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ptStack_d0 = (pointer)0x0;
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_48);
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           *)(local_e8 + 8));
          if (local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)uVar3 == (element_type *)0x0) {
            Runtime::GetLibraryInternal
                      ((Runtime *)local_f8,
                       (String *)
                       (this->m_runtime).
                       super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_f8._0_8_;
            local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
            if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                         _M_weak_this).
                         super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8)
                               )->_M_weak_this).
                              super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
                UNLOCK();
              }
              else {
                *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8))->
                         _M_weak_this).
                         super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f8._8_8_ + 8)
                               )->_M_weak_this).
                              super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
              }
            }
            CheckFunctionCall((FunctionMatch *)local_e8,this,&local_90,currSym,endSym,
                              skipInitialParam);
            local_128 = (element_type *)local_e8._0_8_;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
                 _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_48._M_impl.super__Vector_impl_data._M_finish =
                 _Stack_120._M_impl.super__Vector_impl_data._M_finish;
            local_48._M_impl.super__Vector_impl_data._M_start =
                 _Stack_120._M_impl.super__Vector_impl_data._M_start;
            _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
            _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_pi;
            _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_d0;
            local_e8._8_8_ = (element_type *)0x0;
            local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ptStack_d0 = (pointer)0x0;
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&local_48);
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                             *)(local_e8 + 8));
            if ((element_type *)
                local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_90.
                         super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            this_00 = (element_type *)local_f8._8_8_;
            if (local_128 == (element_type *)0x0) {
              pSVar8 = (Symbol *)
                       (this->m_importList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_70 = (Symbol *)
                         (this->m_importList).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              uVar5 = (uint)skipInitialParam;
              if (pSVar8 != local_70) {
                do {
                  local_bc = uVar5;
                  peVar2 = (this->m_runtime).
                           super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  local_a8 = (pthread_mutex_t *)&peVar2->m_libraryMutex;
                  iVar6 = pthread_mutex_lock(local_a8);
                  if (iVar6 != 0) {
                    std::__throw_system_error(iVar6);
                  }
                  local_100 = pSVar8;
                  cVar7 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
                          ::find(&(peVar2->m_libraryMap)._M_t,(key_type *)pSVar8);
                  pthread_mutex_unlock(local_a8);
                  if ((_Rb_tree_header *)cVar7._M_node ==
                      &(peVar2->m_libraryMap)._M_t._M_impl.super__Rb_tree_header) {
                    LogWriteLine(Warning,"Unable to find library \'%s\'",*(undefined8 *)local_100);
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00205e66:
                    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
                      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                    }
                    goto LAB_00205b4b;
                  }
                  Runtime::GetLibrary((Runtime *)local_e8,
                                      (String *)
                                      (this->m_runtime).
                                      super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                  uVar4 = local_e8._8_8_;
                  uVar3 = local_e8._0_8_;
                  if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                (local_e8._8_8_ + 8))->_M_weak_this).
                               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                     (local_e8._8_8_ + 8))->_M_weak_this).
                                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                      UNLOCK();
                      if ((element_type *)local_e8._8_8_ == (element_type *)0x0) goto LAB_00205d21;
                    }
                    else {
                      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                (local_e8._8_8_ + 8))->_M_weak_this).
                               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                     (local_e8._8_8_ + 8))->_M_weak_this).
                                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                    }
                    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
                  }
LAB_00205d21:
                  this_01 = local_f8._8_8_;
                  local_f8._0_8_ = uVar3;
                  local_f8._8_8_ = uVar4;
                  if ((element_type *)this_01 != (element_type *)0x0) {
                    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
                  }
                  if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                (local_f8._8_8_ + 8))->_M_weak_this).
                               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                     (local_f8._8_8_ + 8))->_M_weak_this).
                                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                      UNLOCK();
                    }
                    else {
                      *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                (local_f8._8_8_ + 8))->_M_weak_this).
                               super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr =
                           *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                     (local_f8._8_8_ + 8))->_M_weak_this).
                                    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1;
                    }
                  }
                  local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_f8._0_8_;
                  local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_
                  ;
                  CheckFunctionCall((FunctionMatch *)local_e8,this,&local_a0,currSym,endSym,
                                    SUB41(local_bc,0));
                  pSVar8 = local_100;
                  if ((element_type *)
                      local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (element_type *)0x0) {
                    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a0.
                               super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  uVar3 = local_e8._0_8_;
                  if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
                    if (local_128 == (element_type *)0x0) {
                      local_128 = (element_type *)local_e8._0_8_;
                      std::
                      vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ::operator=((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                   *)&_Stack_120,
                                  (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                   *)(local_e8 + 8));
                      if ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar3 + 0x410))->
                           _M_use_count != 1) ||
                         ((element_type *)local_f8._0_8_ ==
                          (this->m_library).
                          super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )) goto LAB_00205de9;
                      level = Error;
                      format = "Unable to call library function with private scope.";
                    }
                    else {
                      level = Warning;
                      format = 
                      "Ambiguous function name detected.  Use library name to disambiguate.";
                    }
                    LogWriteLine(level,format);
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
                    (__return_storage_ptr__->partData).
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    std::
                    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                     *)(local_e8 + 8));
                    goto LAB_00205e66;
                  }
LAB_00205de9:
                  std::
                  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                  ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                   *)(local_e8 + 8));
                  pSVar8 = (Symbol *)((long)&(pSVar8->text).field_2 + 8);
                  uVar5 = local_bc;
                  this_00 = (element_type *)local_f8._8_8_;
                } while (pSVar8 != local_70);
              }
            }
            goto joined_r0x00205c4e;
          }
        }
      }
      else {
        if (currSym._M_current + 1 ==
            (this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00205b2a;
        Runtime::GetLibrary((Runtime *)local_e8,
                            (String *)
                            (this->m_runtime).
                            super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        this_00 = (element_type *)local_e8._8_8_;
        if ((element_type *)local_e8._8_8_ == (element_type *)0x0) {
          local_b8.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e8._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e8._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
            if ((element_type *)local_e8._8_8_ != (element_type *)0x0) goto LAB_002059dd;
          }
          else {
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e8._8_8_ + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e8._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
LAB_002059dd:
            local_100 = endSym._M_current;
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            endSym._M_current = local_100;
          }
          local_b8.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                     _M_weak_this).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr =
                 *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                          _M_weak_this).
                          super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        CheckFunctionCall((FunctionMatch *)local_e8,this,&local_b8,currSym._M_current + 1,endSym,
                          skipInitialParam);
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
             _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48._M_impl.super__Vector_impl_data._M_finish =
             _Stack_120._M_impl.super__Vector_impl_data._M_finish;
        local_48._M_impl.super__Vector_impl_data._M_start =
             _Stack_120._M_impl.super__Vector_impl_data._M_start;
        _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._8_8_;
        _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_pi;
        _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_d0;
        local_e8._8_8_ = (element_type *)0x0;
        local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ptStack_d0 = (pointer)0x0;
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&local_48);
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         *)(local_e8 + 8));
        local_128 = (element_type *)local_e8._0_8_;
        if ((element_type *)
            local_b8.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_b8.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
joined_r0x00205c4e:
        if (this_00 != (element_type *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
      }
LAB_00205b2a:
      __return_storage_ptr__->signature = (FunctionSignature *)local_128;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           _Stack_120._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           _Stack_120._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00205b4b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
                  (&local_68,local_68.field_2._M_allocated_capacity);
      }
      goto LAB_002058e3;
    }
  }
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->signature = (FunctionSignature *)0x0;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_120._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_120._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_120._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_002058e3:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&_Stack_120);
  return __return_storage_ptr__;
}

Assistant:

inline Parser::FunctionMatch Parser::CheckFunctionCall(bool skipInitialParam, SymbolListCItr currSym, SymbolListCItr endSym) const
	{
		FunctionMatch match;

		// Store current symbol
		auto currentSymbol = currSym;

		// Check for error or invalid symbols
		if (m_error || currentSymbol == m_symbolList.end())
			return match;

		// Any operators other than open parentheses mean this can't be a function call
		if (IsOperator(currentSymbol->type) && (currentSymbol->type != SymbolType::ParenOpen))
			return match;

		// Check for explicit library name in the first symbol.  libraryName is empty if not found.
		String libraryName = CheckLibraryName();

		// Advance the current symbol if we found a valid library name
		if (!libraryName.empty())
		{
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return match;
		}

		// If we explicitly specify a library name, then only look in that library
		if (!libraryName.empty())
		{
			auto library = m_runtime->GetLibraryInternal(libraryName);
			match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
		}
		else
		{
			// Check local function table for signature match
			match = CheckFunctionCall(m_localFunctions, currentSymbol, endSym, skipInitialParam);

			// If not found in local function table, search in libraries for a function match
			if (!match.signature)
			{
				// Check the current library for a signature match
				match = CheckFunctionCall(m_library, currentSymbol, endSym, skipInitialParam);

				// If a library name isn't specified or a signature wasn't found, search first in current library, then in order of imports
				if (!match.signature)
				{
					// Search default library first
					auto library = m_runtime->GetLibraryInternal(libraryName);
					match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);

					// If function wasn't found in default library, search through all import libraries
					if (!match.signature)
					{
						// Loop through all imported library names
						for (const auto & libName : m_importList)
						{
							// Make sure the library exists
							if (!m_runtime->LibraryExists(libName))
							{
								LogWriteLine(LogLevel::Warning, "Unable to find library '%s'", libName.c_str());
								return FunctionMatch();
							}

							// Search for function in this library
							library = m_runtime->GetLibraryInternal(libName);
							auto newMatch = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
							if (newMatch.signature)
							{
								if (match.signature)
								{
									LogWriteLine(LogLevel::Warning, "Ambiguous function name detected.  Use library name to disambiguate.");
									return FunctionMatch();
								}
								else
								{
									match = newMatch;
									if (match.signature->GetVisibility() == VisibilityType::Private && library != m_library)
									{
										LogWriteLine(LogLevel::Error, "Unable to call library function with private scope.");
										return FunctionMatch();
									}
								}
							}
						}
					}
				}
			}
		}

		return match;
	}